

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elem_alg.c
# Opt level: O0

void pnga_step_max_patch(Integer g_a,Integer *alo,Integer *ahi,Integer g_b,Integer *blo,Integer *bhi
                        ,void *result)

{
  logical lVar1;
  long g_a_00;
  Integer IVar2;
  long in_RCX;
  Integer *in_RDX;
  Integer *in_RSI;
  Integer in_RDI;
  Integer *in_R8;
  Integer *in_R9;
  char *unaff_retaddr;
  double *in_stack_00000008;
  void *sresult;
  Integer compatible;
  int i;
  int local_sync_end;
  int local_sync_begin;
  float fresult;
  Integer btotal;
  Integer atotal;
  Integer in_stack_00000080;
  int iresult;
  Integer g_c;
  Integer index [7];
  Integer bdims [7];
  Integer bndim;
  Integer btype;
  Integer adims [7];
  Integer andim;
  Integer atype;
  long lresult;
  double dresult;
  Integer *in_stack_000002f0;
  undefined4 in_stack_000002f8;
  int in_stack_000002fc;
  Integer *in_stack_00000300;
  Integer *in_stack_00000308;
  Integer in_stack_00000310;
  Integer *in_stack_00000378;
  void *in_stack_00000380;
  char *in_stack_00000388;
  Integer in_stack_00000390;
  char *in_stack_fffffffffffffe68;
  Integer in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  float in_stack_fffffffffffffe7c;
  Integer *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  Integer *in_stack_fffffffffffffe90;
  Integer *in_stack_fffffffffffffe98;
  ulong g_c_00;
  int iVar3;
  int iVar4;
  int iVar5;
  float in_stack_fffffffffffffec4;
  long local_138;
  long local_130;
  float local_124;
  long local_120;
  long local_d8 [8];
  long local_98;
  long local_90;
  long local_88 [7];
  long local_50;
  long local_48;
  double local_40;
  double local_38;
  Integer *local_30;
  Integer *local_28;
  long local_20;
  Integer *local_18;
  Integer *local_10;
  
  iVar4 = _ga_sync_end;
  iVar5 = _ga_sync_begin;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (iVar5 != 0) {
    pnga_sync();
  }
  pnga_check_handle(_i,(char *)compatible);
  pnga_check_handle(_i,(char *)compatible);
  pnga_inquire(in_stack_00000080,(Integer *)atotal,(Integer *)btotal,_local_sync_begin);
  pnga_inquire(in_stack_00000080,(Integer *)atotal,(Integer *)btotal,_local_sync_begin);
  if (local_48 != local_90) {
    pnga_error(unaff_retaddr,in_RDI);
  }
  for (iVar3 = 0; iVar3 < local_50; iVar3 = iVar3 + 1) {
    if ((local_10[iVar3] < 1) || (local_88[iVar3] < local_18[iVar3])) {
      pnga_error(unaff_retaddr,in_RDI);
    }
  }
  for (iVar3 = 0; iVar3 < local_98; iVar3 = iVar3 + 1) {
    if ((local_28[iVar3] < 1) || (local_d8[iVar3] < local_30[iVar3])) {
      pnga_error(unaff_retaddr,in_RDI);
    }
  }
  local_130 = 1;
  for (iVar3 = 0; iVar3 < local_50; iVar3 = iVar3 + 1) {
    local_130 = ((local_18[iVar3] - local_10[iVar3]) + 1) * local_130;
  }
  local_138 = 1;
  for (iVar3 = 0; iVar3 < local_98; iVar3 = iVar3 + 1) {
    local_138 = ((local_30[iVar3] - local_28[iVar3]) + 1) * local_138;
  }
  if (local_138 != local_130) {
    pnga_error(unaff_retaddr,in_RDI);
  }
  lVar1 = pnga_comp_patch(local_50,local_10,local_18,local_98,local_28,local_30);
  g_c_00 = (ulong)(lVar1 != 0);
  pnga_type_f2c(0x3f2);
  pnga_gop((Integer)in_stack_fffffffffffffe80,
           (void *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
           in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  if (g_c_00 == 0) {
    pnga_error(unaff_retaddr,in_RDI);
  }
  g_a_00 = local_48 + -0x3e9;
  switch(g_a_00) {
  case 0:
    break;
  case 1:
    break;
  case 2:
    break;
  case 3:
    break;
  default:
    pnga_error(unaff_retaddr,in_RDI);
    break;
  case 5:
  case 6:
    pnga_error(unaff_retaddr,in_RDI);
  }
  if (in_RDI == local_20) {
    switch(local_48) {
    case 0x3e9:
      *(float *)in_stack_00000008 = NAN;
      break;
    case 0x3ea:
      *in_stack_00000008 = NAN;
      break;
    case 0x3eb:
      *(float *)in_stack_00000008 = 1e+37;
      break;
    case 0x3ec:
      *in_stack_00000008 = 1e+307;
      break;
    default:
      pnga_error(unaff_retaddr,in_RDI);
      break;
    case 0x3ee:
    case 0x3ef:
      pnga_error(unaff_retaddr,in_RDI);
    }
  }
  else {
    IVar2 = has_negative_elem((Integer)in_stack_00000300,
                              (Integer *)CONCAT44(in_stack_000002fc,in_stack_000002f8),
                              in_stack_000002f0);
    if (IVar2 == 1) {
      pnga_error(unaff_retaddr,in_RDI);
    }
    pnga_duplicate(bdims[3],(Integer *)bdims[2],(char *)bdims[1]);
    if (local_120 == 0) {
      pnga_error(unaff_retaddr,in_RDI);
    }
    pnga_elem_step_divide_patch
              (g_a_00,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
               CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
               in_stack_fffffffffffffe80,
               (Integer *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),g_c_00,
               (Integer *)CONCAT44(iVar4,iVar3),(Integer *)CONCAT44(in_stack_fffffffffffffec4,iVar5)
              );
    ngai_elem3_patch_(in_stack_00000310,in_stack_00000308,in_stack_00000300,in_stack_000002fc);
    pnga_select_elem(in_stack_00000390,in_stack_00000388,in_stack_00000380,in_stack_00000378);
    switch(local_48) {
    case 0x3e9:
      if ((int)local_124 < 0) {
        local_124 = (float)-(int)local_124;
      }
      *(float *)in_stack_00000008 = local_124;
      break;
    case 0x3ea:
      if ((long)local_40 < 0) {
        local_40 = (double)-(long)local_40;
      }
      *in_stack_00000008 = local_40;
      break;
    case 0x3eb:
      in_stack_fffffffffffffe7c = in_stack_fffffffffffffec4;
      if (in_stack_fffffffffffffec4 < 0.0) {
        in_stack_fffffffffffffe7c = -in_stack_fffffffffffffec4;
      }
      *(float *)in_stack_00000008 = in_stack_fffffffffffffe7c;
      break;
    case 0x3ec:
      if (local_38 < 0.0) {
        local_38 = -local_38;
      }
      *in_stack_00000008 = local_38;
      break;
    default:
      pnga_error(unaff_retaddr,in_RDI);
      break;
    case 0x3ee:
    case 0x3ef:
      pnga_error(unaff_retaddr,in_RDI);
    }
    pnga_destroy(CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  }
  if (iVar4 != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void pnga_step_max_patch(g_a,  alo, ahi, g_b,  blo, bhi, result) 
     Integer g_a, *alo, *ahi;    /* patch of g_a */
     Integer g_b, *blo, *bhi;    /* patch of g_b */
     void *result;
#if 0
     Integer op; /* operations */
#endif

{
  double  dresult;
  long    lresult;
  Integer atype;
  Integer andim, adims[MAXDIM];
  Integer btype;
  Integer bndim, bdims[MAXDIM];
  Integer index[MAXDIM];
  /* Integer num_blocks_a, num_blocks_b; */
  /* double result = -1; */
  Integer g_c;
  int iresult;
  Integer atotal,btotal;
  float   fresult;
  int local_sync_begin,local_sync_end;
  int i;
  Integer compatible;
  void *sresult = NULL;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync();

  /* Check for valid ga handles. */

  pnga_check_handle(g_a, "ga_step_max_patch_");
  pnga_check_handle(g_b, "ga_step_max_patch_");


  /* get chacteristics of the input ga patches */

  pnga_inquire(g_a, &atype, &andim, adims);
  pnga_inquire(g_b, &btype, &bndim, bdims);
  /* num_blocks_a = pnga_total_blocks(g_a); */
  /* num_blocks_b = pnga_total_blocks(g_b); */

  /* Check for matching types. */
  if(atype != btype) pnga_error(" ga_step_max_patch_: types mismatch ", 0L); 

  /* check if patch indices and dims match */
  for(i=0; i<andim; i++)
    if(alo[i] <= 0 || ahi[i] > adims[i])
      pnga_error("g_a indices out of range ", g_a);
  for(i=0; i<bndim; i++)
    if(blo[i] <= 0 || bhi[i] > bdims[i])
      pnga_error("g_b indices out of range ", g_b);

  /* check if numbers of elements in patches match each other */
  atotal = 1; for(i=0; i<andim; i++) atotal *= (ahi[i] - alo[i] + 1);
  btotal = 1; for(i=0; i<bndim; i++) btotal *= (bhi[i] - blo[i] + 1);

  if(btotal != atotal)
    pnga_error(" ga_step_max_patch_ capacities of patches do not match ", 0L);

  /* test if patches match */
  if(pnga_comp_patch(andim, alo, ahi, bndim, blo, bhi)) compatible = 1;
  else compatible = 0;
  /* pnga_gop(pnga_type_f2c(MT_F_INT), &compatible, 1, "*"); */
  pnga_gop(pnga_type_f2c(MT_F_INT), &compatible, 1, "&&");
  if(!compatible) {
    pnga_error(" ga_step_max_patch_ mismatched patchs ",0);
  }

  switch (atype)
  {
    case C_INT:
      sresult = &iresult;
      break;
    case C_DCPL:
    case C_SCPL:
      pnga_error("Ga_step_max_patch_: unavalable for complex datatype.", 
          atype);
      break;
    case C_DBL:
      sresult = &dresult;
      break;
    case C_FLOAT:
      sresult = &fresult;
      break;
    case C_LONG:
      sresult = &lresult;
      break;
    default:
      pnga_error("Ga_step_max_patch_: wrong data type.", atype);
  }

  if(g_a == g_b) {
    /* It used to say 1, but if ga and gb are the same, and 
       ga is nonnegative then any number of multiples of gb
       can be added to ga still leaving it nonnegative.
     *result = (double)1.0;
     */
    switch (atype)
    {
      case C_INT:
        *(int*)result = GA_INFINITY_I;
        break;
      case C_DCPL:
      case C_SCPL:
        pnga_error("Ga_step_max_patch_: unavailable for complex datatype.", 
            atype);
        break;
      case C_DBL:
        *(double*)result = GA_INFINITY_D;
        break;
      case C_FLOAT:
        *(float*)result = GA_INFINITY_F;
        break;
      case C_LONG:
        *(long*)result = GA_INFINITY_L;
        break;
      default:
        pnga_error("Ga_step_max_patch_: wrong data type.", atype);
    }
  } else {
    /*Now look at each element of the array g_a. 
      If an element of g_a is negative, then simply return */ 
    if(has_negative_elem(g_a, alo, ahi) == 1)
      pnga_error("ga_step_max_patch_: g_a has negative element.", -1);

    /*duplicate an array c to hold the temparate result = g_a/g_b; */
    pnga_duplicate(g_a, &g_c, "Temp");
    if(g_c==0)
      pnga_error("ga_step_max_patch_:fail to duplicate array c", g_a);

    /*
       pnga_elem_divide_patch(g_a, alo, ahi, g_b, blo, bhi, g_c, alo, ahi);
     */
    pnga_elem_step_divide_patch(g_a, alo, ahi, g_b, blo, bhi, 
        g_c, alo, ahi);

    /*Now look at each element of the array g_c. If an element of g_c is positive,
      then replace it with -GA_INFINITY */ 
    ngai_elem3_patch_(g_c, alo, ahi, OP_STEPMAX);  
    /*Then, we will select the maximum of the array g_c*/ 
    pnga_select_elem(g_c, "max", sresult, index); 
    switch (atype)
    {
      case C_INT:
        *(int*)result = GA_ABS(iresult);
        break;
      case C_DCPL:
      case C_SCPL:
        pnga_error("Ga_step_max_patch_: unavailable for complex datatype.", 
            atype);
        break;
      case C_DBL:
        *(double*)result = GA_ABS(dresult);
        break;
      case C_FLOAT:
        *(float*)result = GA_ABS(fresult);
        break;
      case C_LONG:
        *(long*)result = GA_ABS(lresult);
        break;
      default:
        pnga_error("Ga_step_max_patch_: wrong data type.", atype);
    }
    pnga_destroy(g_c);
  }
  if(local_sync_end)pnga_sync();
}